

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O3

int __thiscall
basisu::palette_index_reorderer::init(palette_index_reorderer *this,EVP_PKEY_CTX *ctx)

{
  uint *puVar1;
  uint32_t i;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  uint in_ECX;
  uint32_t *in_RDX;
  uint32_t new_size;
  int iVar7;
  uint32_t *puVar8;
  pEntry_dist_func in_R8;
  void *in_R9;
  uint32_t new_size_2;
  uint min_new_capacity;
  float in_XMM0_Da;
  float fVar9;
  uint32_t entry_to_move;
  uint32_t best_entry;
  double best_count;
  uint32_t local_6c;
  float local_68;
  uint local_64;
  elemental_vector *local_60;
  uint local_54;
  uint_vec *local_50;
  void *local_48;
  pEntry_dist_func local_40;
  double local_38;
  
  local_54 = (uint)ctx;
  if ((local_54 == 0) || (in_ECX == 0)) {
    __assert_fail("(num_syms > 0) && (num_indices > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                  ,0x4e9,
                  "void basisu::palette_index_reorderer::init(uint32_t, const uint32_t *, uint32_t, pEntry_dist_func, void *, float)"
                 );
  }
  if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
    __assert_fail("(dist_func_weight >= 0.0f) && (dist_func_weight <= 1.0f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                  ,0x4ea,
                  "void basisu::palette_index_reorderer::init(uint32_t, const uint32_t *, uint32_t, pEntry_dist_func, void *, float)"
                 );
  }
  local_68 = in_XMM0_Da;
  clear(this);
  local_50 = &this->m_remap_table;
  uVar2 = (this->m_remap_table).m_size;
  if (uVar2 != in_ECX) {
    if (uVar2 <= in_ECX) {
      if ((this->m_remap_table).m_capacity < in_ECX) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_50,in_ECX,uVar2 + 1 == in_ECX,4,(object_mover)0x0,false
                  );
        uVar2 = (this->m_remap_table).m_size;
      }
      memset(local_50->m_p + uVar2,0,(ulong)(in_ECX - uVar2) << 2);
    }
    (this->m_remap_table).m_size = in_ECX;
  }
  local_60 = (elemental_vector *)&this->m_entries_picked;
  local_48 = (void *)(ulong)in_ECX;
  vector<unsigned_int>::reserve((vector<unsigned_int> *)local_60,(size_t)(ulong)in_ECX);
  uVar2 = (this->m_total_count_to_picked).m_size;
  pvVar4 = (void *)(ulong)uVar2;
  if (uVar2 != in_ECX) {
    if (uVar2 <= in_ECX) {
      if ((this->m_total_count_to_picked).m_capacity < in_ECX) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_total_count_to_picked,in_ECX,uVar2 + 1 == in_ECX,4,
                   (object_mover)0x0,false);
        uVar2 = (this->m_total_count_to_picked).m_size;
      }
      pvVar4 = memset((this->m_total_count_to_picked).m_p + uVar2,0,(ulong)(in_ECX - uVar2) << 2);
    }
    (this->m_total_count_to_picked).m_size = in_ECX;
  }
  if (1 < local_54) {
    prepare_hist(this,in_ECX,local_54,in_RDX);
    find_initial(this,in_ECX);
    uVar2 = (this->m_entries_to_do).m_size;
    local_40 = in_R8;
    while (uVar2 != 0) {
      find_next_entry(this,&local_64,&local_38,in_R8,in_R9,local_68);
      uVar2 = local_64;
      uVar6 = (ulong)local_64;
      if ((this->m_entries_to_do).m_size <= local_64) goto LAB_0022138b;
      local_6c = (this->m_entries_to_do).m_p[uVar6];
      fVar9 = pick_side(this,in_ECX,local_6c,in_R8,in_R9,local_68);
      puVar8 = (this->m_entries_picked).m_p;
      if (fVar9 <= 0.0) {
        uVar3 = (this->m_entries_picked).m_size;
        uVar5 = (ulong)uVar3;
        if (&local_6c < puVar8 + uVar5 && (puVar8 <= &local_6c && puVar8 != (uint32_t *)0x0)) {
          __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                        ,0x267,
                        "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]"
                       );
        }
        if ((this->m_entries_picked).m_capacity <= uVar3) {
          elemental_vector::increase_capacity(local_60,uVar3 + 1,true,4,(object_mover)0x0,false);
          puVar8 = (this->m_entries_picked).m_p;
          uVar5 = (ulong)(this->m_entries_picked).m_size;
        }
        puVar8[uVar5] = local_6c;
        puVar8 = &(this->m_entries_picked).m_size;
        *puVar8 = *puVar8 + 1;
      }
      else {
        uVar3 = (this->m_entries_picked).m_size;
        uVar5 = (ulong)uVar3;
        min_new_capacity = uVar3 + 1;
        if (min_new_capacity != 0) {
          if ((this->m_entries_picked).m_capacity < min_new_capacity) {
            elemental_vector::increase_capacity
                      (local_60,min_new_capacity,true,4,(object_mover)0x0,false);
            uVar3 = (this->m_entries_picked).m_size;
            puVar8 = (this->m_entries_picked).m_p;
          }
          memset(puVar8 + uVar3,0,(ulong)(min_new_capacity - uVar3) << 2);
          puVar8 = (uint32_t *)local_60->m_p;
        }
        (this->m_entries_picked).m_size = min_new_capacity;
        memmove(puVar8 + 1,puVar8,uVar5 << 2);
        *(this->m_entries_picked).m_p = local_6c;
        in_R8 = local_40;
      }
      uVar3 = (this->m_entries_to_do).m_size;
      if (uVar3 <= uVar2) {
        __assert_fail("(p >= m_p) && (p < (m_p + m_size))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x312,"void basisu::vector<unsigned int>::erase(T *) [T = unsigned int]");
      }
      puVar1 = (this->m_entries_to_do).m_p;
      memmove(puVar1 + uVar6,puVar1 + uVar6 + 1,(ulong)(uVar3 + ~uVar2) << 2);
      puVar8 = &(this->m_entries_to_do).m_size;
      *puVar8 = *puVar8 - 1;
      if (*puVar8 == 0) break;
      uVar6 = 0;
      do {
        uVar2 = (this->m_entries_to_do).m_p[uVar6];
        if ((int)local_6c < (int)uVar2) {
          iVar7 = local_6c * in_ECX + uVar2;
        }
        else {
          iVar7 = uVar2 * in_ECX + local_6c;
        }
        if ((ulong)(this->m_hist).m_size <= (ulong)(long)iVar7) {
          __assert_fail("i < m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                        ,0x177,
                        "const T &basisu::vector<unsigned int>::operator[](size_t) const [T = unsigned int]"
                       );
        }
        if ((this->m_total_count_to_picked).m_size <= uVar2) goto LAB_0022138b;
        puVar1 = (this->m_total_count_to_picked).m_p + uVar2;
        *puVar1 = *puVar1 + (this->m_hist).m_p[iVar7];
        uVar6 = uVar6 + 1;
        uVar2 = (this->m_entries_to_do).m_size;
      } while (uVar6 < uVar2);
    }
    pvVar4 = (void *)0x0;
    do {
      if (((void *)(ulong)(this->m_entries_picked).m_size <= pvVar4) ||
         (uVar2 = (this->m_entries_picked).m_p[(long)pvVar4], (this->m_remap_table).m_size <= uVar2)
         ) {
LAB_0022138b:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,
                      "T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]");
      }
      local_50->m_p[uVar2] = (uint)pvVar4;
      pvVar4 = (void *)((long)pvVar4 + 1);
    } while (local_48 != pvVar4);
  }
  return (int)pvVar4;
}

Assistant:

void palette_index_reorderer::init(uint32_t num_indices, const uint32_t *pIndices, uint32_t num_syms, pEntry_dist_func pDist_func, void *pCtx, float dist_func_weight)
	{
		assert((num_syms > 0) && (num_indices > 0));
		assert((dist_func_weight >= 0.0f) && (dist_func_weight <= 1.0f));

		clear();

		m_remap_table.resize(num_syms);
		m_entries_picked.reserve(num_syms);
		m_total_count_to_picked.resize(num_syms);

		if (num_indices <= 1)
			return;

		prepare_hist(num_syms, num_indices, pIndices);
		find_initial(num_syms);

		while (m_entries_to_do.size())
		{
			// Find the best entry to move into the picked list.
			uint32_t best_entry;
			double best_count;
			find_next_entry(best_entry, best_count, pDist_func, pCtx, dist_func_weight);

			// We now have chosen an entry to place in the picked list, now determine which side it goes on.
			const uint32_t entry_to_move = m_entries_to_do[best_entry];
								
			float side = pick_side(num_syms, entry_to_move, pDist_func, pCtx, dist_func_weight);
								
			// Put entry_to_move either on the "left" or "right" side of the picked entries
			if (side <= 0)
				m_entries_picked.push_back(entry_to_move);
			else
				m_entries_picked.insert(m_entries_picked.begin(), entry_to_move);

			// Erase best_entry from the todo list
			m_entries_to_do.erase(m_entries_to_do.begin() + best_entry);

			// We've just moved best_entry to the picked list, so now we need to update m_total_count_to_picked[] to factor the additional count to best_entry
			for (uint32_t i = 0; i < m_entries_to_do.size(); i++)
				m_total_count_to_picked[m_entries_to_do[i]] += get_hist(m_entries_to_do[i], entry_to_move, num_syms);
		}

		for (uint32_t i = 0; i < num_syms; i++)
			m_remap_table[m_entries_picked[i]] = i;
	}